

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewAttribute::Update(DataViewAttribute *this,DataModel *model)

{
  bool bVar1;
  Element *element;
  DataExpression *this_00;
  Variant *this_01;
  String *name;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Variant local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  DataExpressionInterface local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Variant::Variant(&local_a8);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_60,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&local_60,&local_a8);
    if (bVar1) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      Variant::Get<std::__cxx11::string>(&local_c8,&local_a8,&local_80);
      name = &(this->super_DataViewCommon).modifier;
      ::std::__cxx11::string::~string((string *)&local_80);
      this_01 = Element::GetAttribute(element,name);
      if (this_01 == (Variant *)0x0) {
LAB_0026e4c4:
        bVar1 = true;
        Element::SetAttribute<std::__cxx11::string>(element,name,&local_c8);
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        Variant::Get<std::__cxx11::string>(&local_48,this_01,&local_e8);
        bVar1 = ::std::operator!=(&local_48,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_48);
        ::std::__cxx11::string::~string((string *)&local_e8);
        if (bVar1) goto LAB_0026e4c4;
        bVar1 = false;
      }
      ::std::__cxx11::string::~string((string *)&local_c8);
      goto LAB_0026e4e9;
    }
  }
  bVar1 = false;
LAB_0026e4e9:
  Variant::~Variant(&local_a8);
  return bVar1;
}

Assistant:

bool DataViewAttribute::Update(DataModel& model)
{
	const String& attribute_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const String value = variant.Get<String>();
		const Variant* attribute = element->GetAttribute(attribute_name);

		if (!attribute || attribute->Get<String>() != value)
		{
			element->SetAttribute(attribute_name, value);
			result = true;
		}
	}
	return result;
}